

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symbol.c
# Opt level: O1

int symbol_generate(lgx_ast_t *ast,lgx_ast_node_t *node)

{
  char cVar1;
  byte bVar2;
  lgx_ast_node_s **pplVar3;
  lgx_ast_node_t *plVar4;
  lgx_type_function_s *plVar5;
  int iVar6;
  lgx_symbol_t *plVar7;
  lgx_type_t *plVar8;
  lgx_ast_node_s *plVar9;
  lgx_ht_t *symbols;
  char *pcVar10;
  ulong uVar11;
  long lVar12;
  uint uVar13;
  bool bVar14;
  bool bVar15;
  lgx_str_t local_40;
  
  cVar1 = *(char *)node;
  if (cVar1 == '\x18') {
    if (node->children != 5) {
      __assert_fail("node->children == 5",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/fcten[P]xscript/src/parser/symbol.c"
                    ,0x1ae,"int symbol_add_function(lgx_ast_t *, lgx_ast_node_t *)");
    }
    pplVar3 = node->child;
    if (*(char *)*pplVar3 != ',') {
      __assert_fail("node->child[0]->type == FUNCTION_RECEIVER",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/fcten[P]xscript/src/parser/symbol.c"
                    ,0x1af,"int symbol_add_function(lgx_ast_t *, lgx_ast_node_t *)");
    }
    if (*(char *)pplVar3[1] != '#') {
      __assert_fail("node->child[1]->type == IDENTIFIER_TOKEN",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/fcten[P]xscript/src/parser/symbol.c"
                    ,0x1b0,"int symbol_add_function(lgx_ast_t *, lgx_ast_node_t *)");
    }
    if (*(char *)pplVar3[2] != '\x1b') {
      __assert_fail("node->child[2]->type == FUNCTION_DECL_PARAMETER",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/fcten[P]xscript/src/parser/symbol.c"
                    ,0x1b1,"int symbol_add_function(lgx_ast_t *, lgx_ast_node_t *)");
    }
    if (*(char *)pplVar3[3] != '\"') {
      __assert_fail("node->child[3]->type == TYPE_EXPRESSION",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/fcten[P]xscript/src/parser/symbol.c"
                    ,0x1b2,"int symbol_add_function(lgx_ast_t *, lgx_ast_node_t *)");
    }
    if (*(char *)pplVar3[4] != '\x01') {
      __assert_fail("node->child[4]->type == BLOCK_STATEMENT",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/fcten[P]xscript/src/parser/symbol.c"
                    ,0x1b3,"int symbol_add_function(lgx_ast_t *, lgx_ast_node_t *)");
    }
    local_40.buffer = (ast->lex).source.content + pplVar3[1]->offset;
    local_40.length = pplVar3[1]->length;
    local_40.size = 0;
    plVar9 = node->parent;
    if ((plVar9 == (lgx_ast_node_s *)0x0) || (*(char *)plVar9 != '\x01')) {
      bVar14 = false;
    }
    else {
      bVar14 = plVar9->parent == (lgx_ast_node_s *)0x0;
    }
    bVar15 = *(char *)plVar9 != '\x01';
    if (bVar15) {
      plVar7 = (lgx_symbol_t *)0x0;
      symbol_error(ast,node,"[invalid function declaration] %.*s\n");
    }
    else {
      plVar7 = symbol_add(ast,node,(plVar9->u).symbols,S_CONSTANT,&local_40,bVar14);
    }
    uVar13 = 1;
    if (plVar7 == (lgx_symbol_t *)0x0) goto LAB_0011dec2;
    iVar6 = lgx_type_init(&plVar7->type,T_FUNCTION);
    if (iVar6 != 0) {
      symbol_error(ast,node,"out of memory\n");
      goto LAB_0011dec2;
    }
    plVar4 = *node->child;
    if (*(char *)plVar4 != ',') {
      __assert_fail("node->type == FUNCTION_RECEIVER",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/fcten[P]xscript/src/parser/symbol.c"
                    ,0x78,
                    "int symbol_parse_type_function_receiver(lgx_ast_t *, lgx_ast_node_t *, lgx_type_function_t *)"
                   );
    }
    bVar14 = bVar15;
    if (plVar4->children != 0) {
      if (plVar4->children != 1) {
        __assert_fail("node->children == 1",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/fcten[P]xscript/src/parser/symbol.c"
                      ,0x7e,
                      "int symbol_parse_type_function_receiver(lgx_ast_t *, lgx_ast_node_t *, lgx_type_function_t *)"
                     );
      }
      plVar9 = *plVar4->child;
      if (*(char *)plVar9 != '\x1b') {
        __assert_fail("node->child[0]->type == FUNCTION_DECL_PARAMETER",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/fcten[P]xscript/src/parser/symbol.c"
                      ,0x7f,
                      "int symbol_parse_type_function_receiver(lgx_ast_t *, lgx_ast_node_t *, lgx_type_function_t *)"
                     );
      }
      if (plVar9->children == 1) {
        plVar9 = *plVar9->child;
        if (*(char *)plVar9 != '\x16') {
          __assert_fail("node->child[0]->child[0]->type == VARIABLE_DECLARATION",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/fcten[P]xscript/src/parser/symbol.c"
                        ,0x86,
                        "int symbol_parse_type_function_receiver(lgx_ast_t *, lgx_ast_node_t *, lgx_type_function_t *)"
                       );
        }
        if (plVar9->children != 2) {
          __assert_fail("node->child[0]->child[0]->children == 2",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/fcten[P]xscript/src/parser/symbol.c"
                        ,0x87,
                        "int symbol_parse_type_function_receiver(lgx_ast_t *, lgx_ast_node_t *, lgx_type_function_t *)"
                       );
        }
        if (*(char *)plVar9->child[1] != '\"') {
          __assert_fail("node->child[0]->child[0]->child[1]->type == TYPE_EXPRESSION",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/fcten[P]xscript/src/parser/symbol.c"
                        ,0x88,
                        "int symbol_parse_type_function_receiver(lgx_ast_t *, lgx_ast_node_t *, lgx_type_function_t *)"
                       );
        }
        plVar8 = &((plVar7->type).u.arr)->value;
        iVar6 = symbol_parse_type(ast,plVar9->child[1],plVar8);
        bVar14 = true;
        if (((iVar6 != 0) || (bVar14 = bVar15, plVar8->type == T_UNKNOWN)) ||
           (iVar6 = lgx_type_is_definite(plVar8), iVar6 != 0)) goto LAB_0011df1d;
        pcVar10 = "receiver has incomplete type\n";
      }
      else {
        pcVar10 = "there must be one and only one receiver of a method\n";
      }
      symbol_error(ast,plVar4,pcVar10);
      bVar14 = true;
    }
LAB_0011df1d:
    plVar4 = node->child[2];
    if (*(char *)plVar4 != '\x1b') {
      __assert_fail("node->type == FUNCTION_DECL_PARAMETER",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/fcten[P]xscript/src/parser/symbol.c"
                    ,0xb4,
                    "int symbol_parse_type_function_parameter(lgx_ast_t *, lgx_ast_node_t *, lgx_type_function_t *)"
                   );
    }
    plVar5 = (plVar7->type).u.fun;
    uVar13 = plVar4->children;
    if ((ulong)uVar13 == 0) {
      plVar5->arg_len = uVar13;
      bVar15 = true;
    }
    else {
      plVar8 = (lgx_type_t *)calloc((ulong)uVar13,0x20);
      plVar5->args = plVar8;
      if (plVar8 == (lgx_type_t *)0x0) {
        bVar15 = false;
        symbol_error(ast,plVar4,"out of memory\n");
      }
      else {
        plVar5->arg_len = uVar13;
        lVar12 = 0;
        uVar11 = 0;
        bVar15 = false;
        do {
          plVar9 = plVar4->child[uVar11];
          if (*(char *)plVar9 != '\x16') {
            __assert_fail("node->child[i]->type == VARIABLE_DECLARATION",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/fcten[P]xscript/src/parser/symbol.c"
                          ,0xc1,
                          "int symbol_parse_type_function_parameter(lgx_ast_t *, lgx_ast_node_t *, lgx_type_function_t *)"
                         );
          }
          if (plVar9->children != 2) {
            __assert_fail("node->child[i]->children == 2",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/fcten[P]xscript/src/parser/symbol.c"
                          ,0xc2,
                          "int symbol_parse_type_function_parameter(lgx_ast_t *, lgx_ast_node_t *, lgx_type_function_t *)"
                         );
          }
          if (*(char *)plVar9->child[1] != '\"') {
            __assert_fail("node->child[i]->child[1]->type == TYPE_EXPRESSION",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/fcten[P]xscript/src/parser/symbol.c"
                          ,0xc3,
                          "int symbol_parse_type_function_parameter(lgx_ast_t *, lgx_ast_node_t *, lgx_type_function_t *)"
                         );
          }
          iVar6 = symbol_parse_type(ast,plVar9->child[1],
                                    (lgx_type_t *)((long)&plVar5->args->type + lVar12));
          if (iVar6 != 0) {
            bVar15 = true;
          }
          if ((*(int *)((long)&plVar5->args->type + lVar12) != 0) &&
             (iVar6 = lgx_type_is_definite((lgx_type_t *)((long)&plVar5->args->type + lVar12)),
             iVar6 == 0)) {
            symbol_error(ast,plVar4,"parameter has incomplete type\n");
            bVar15 = true;
          }
          uVar11 = uVar11 + 1;
          lVar12 = lVar12 + 0x20;
        } while (uVar11 < plVar4->children);
        bVar15 = !bVar15;
      }
    }
    iVar6 = symbol_parse_type_function_return
                      (ast,node->child[3],(lgx_type_function_t *)(plVar7->type).u.arr);
    uVar13 = (byte)(~bVar15 | (iVar6 != 0 || bVar14)) & 1;
    goto LAB_0011dec2;
  }
  if (cVar1 == '\x17') {
    if (node->children < 2) {
      __assert_fail("node->children >= 2",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/fcten[P]xscript/src/parser/symbol.c"
                    ,0x17b,"int symbol_add_constant(lgx_ast_t *, lgx_ast_node_t *)");
    }
    pplVar3 = node->child;
    if (*(char *)*pplVar3 != '#') {
      __assert_fail("node->child[0]->type == IDENTIFIER_TOKEN",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/fcten[P]xscript/src/parser/symbol.c"
                    ,0x17c,"int symbol_add_constant(lgx_ast_t *, lgx_ast_node_t *)");
    }
    if (*(char *)pplVar3[1] != '\"') {
      __assert_fail("node->child[1]->type == TYPE_EXPRESSION",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/fcten[P]xscript/src/parser/symbol.c"
                    ,0x17d,"int symbol_add_constant(lgx_ast_t *, lgx_ast_node_t *)");
    }
    local_40.buffer = (ast->lex).source.content + (*pplVar3)->offset;
    local_40.length = (*pplVar3)->length;
    local_40.size = 0;
    plVar9 = node->parent;
    if ((plVar9 == (lgx_ast_node_s *)0x0) || (*(char *)plVar9 != '\x01')) {
      bVar14 = false;
    }
    else {
      bVar14 = plVar9->parent == (lgx_ast_node_s *)0x0;
    }
    cVar1 = *(char *)plVar9;
    if (cVar1 != '\x01') {
      plVar7 = (lgx_symbol_t *)0x0;
      symbol_error(ast,node,"[invalid constant declaration] %.*s\n");
    }
    else {
      plVar7 = symbol_add(ast,node,(plVar9->u).symbols,S_CONSTANT,&local_40,bVar14);
    }
    uVar13 = (uint)(cVar1 != '\x01');
    if (plVar7 != (lgx_symbol_t *)0x0) {
      plVar8 = &plVar7->type;
      iVar6 = symbol_parse_type(ast,node->child[1],plVar8);
      if (iVar6 == 0) {
        if ((plVar8->type == T_UNKNOWN) || (iVar6 = lgx_type_is_definite(plVar8), iVar6 != 0))
        goto LAB_0011dec2;
        pcVar10 = "constant %.*s has incomplete type\n";
        goto LAB_0011deaf;
      }
    }
  }
  else {
    uVar13 = 0;
    if (cVar1 != '\x16') goto LAB_0011dec2;
    if (node->children < 2) {
      __assert_fail("node->children >= 2",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/fcten[P]xscript/src/parser/symbol.c"
                    ,0x128,"int symbol_add_variable(lgx_ast_t *, lgx_ast_node_t *)");
    }
    pplVar3 = node->child;
    if (*(char *)*pplVar3 != '#') {
      __assert_fail("node->child[0]->type == IDENTIFIER_TOKEN",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/fcten[P]xscript/src/parser/symbol.c"
                    ,0x129,"int symbol_add_variable(lgx_ast_t *, lgx_ast_node_t *)");
    }
    if (*(char *)pplVar3[1] != '\"') {
      __assert_fail("node->child[1]->type == TYPE_EXPRESSION",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/fcten[P]xscript/src/parser/symbol.c"
                    ,0x12a,"int symbol_add_variable(lgx_ast_t *, lgx_ast_node_t *)");
    }
    local_40.buffer = (ast->lex).source.content + (*pplVar3)->offset;
    local_40.length = (*pplVar3)->length;
    local_40.size = 0;
    plVar9 = node->parent;
    uVar13 = 0;
    if ((plVar9 == (lgx_ast_node_s *)0x0) || (*(byte *)plVar9 != 1)) {
      bVar14 = false;
    }
    else {
      bVar14 = plVar9->parent == (lgx_ast_node_s *)0x0;
    }
    bVar2 = *(byte *)plVar9;
    if (bVar2 < 0x1b) {
      if (bVar2 == 1) {
        symbols = (plVar9->u).symbols;
        goto LAB_0011de53;
      }
      if (bVar2 == 4) {
        plVar7 = (lgx_symbol_t *)0x0;
        uVar13 = 0;
      }
      else {
LAB_0011dde4:
        symbol_error(ast,node,"[invalid variable declaration] %.*s\n");
LAB_0011ddfb:
        plVar7 = (lgx_symbol_t *)0x0;
        uVar13 = 1;
      }
    }
    else {
      if (bVar2 == 0x1b) {
        plVar9 = plVar9->parent;
        if ((plVar9 == (lgx_ast_node_s *)0x0) || (*(char *)plVar9 != '\x18')) {
          __assert_fail("node->parent->parent && node->parent->parent->type == FUNCTION_DECLARATION"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/fcten[P]xscript/src/parser/symbol.c"
                        ,0x14f,"int symbol_add_variable(lgx_ast_t *, lgx_ast_node_t *)");
        }
        plVar9 = plVar9->child[4];
      }
      else {
        if (bVar2 != 0x1c) goto LAB_0011dde4;
        if (*plVar9->child != node) {
          symbol_error(ast,node,"too many paramters\n");
          goto LAB_0011ddfb;
        }
        plVar9 = plVar9->parent;
        if ((plVar9 == (lgx_ast_node_s *)0x0) || (*(char *)plVar9 != '\x0f')) {
          __assert_fail("node->parent->parent && node->parent->parent->type == CATCH_STATEMENT",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/fcten[P]xscript/src/parser/symbol.c"
                        ,0x15c,"int symbol_add_variable(lgx_ast_t *, lgx_ast_node_t *)");
        }
        plVar9 = plVar9->child[1];
      }
      symbols = (plVar9->u).symbols;
LAB_0011de53:
      plVar7 = symbol_add(ast,node,symbols,S_VARIABLE,&local_40,bVar14);
    }
    if (plVar7 != (lgx_symbol_t *)0x0) {
      plVar8 = &plVar7->type;
      iVar6 = symbol_parse_type(ast,node->child[1],plVar8);
      if (iVar6 == 0) {
        if ((plVar8->type == T_UNKNOWN) || (iVar6 = lgx_type_is_definite(plVar8), iVar6 != 0))
        goto LAB_0011dec2;
        pcVar10 = "variable %.*s has incomplete type\n";
LAB_0011deaf:
        symbol_error(ast,node,pcVar10,(ulong)local_40.length,local_40.buffer);
      }
    }
  }
  uVar13 = 1;
LAB_0011dec2:
  if (node->children != 0) {
    uVar11 = 0;
    do {
      iVar6 = symbol_generate(ast,node->child[uVar11]);
      if (iVar6 != 0) {
        uVar13 = 1;
      }
      uVar11 = uVar11 + 1;
    } while (uVar11 < node->children);
  }
  return uVar13;
}

Assistant:

static int symbol_generate(lgx_ast_t* ast, lgx_ast_node_t* node) {
    int i, ret = 0;

    switch (node->type) {
        case PACKAGE_DECLARATION:
            break;
        case IMPORT_DECLARATION:
            break;
        case EXPORT_DECLARATION:
            break;
        case VARIABLE_DECLARATION:
            if (symbol_add_variable(ast, node)) {
                ret = 1;
            }
            break;
        case CONSTANT_DECLARATION:
            if (symbol_add_constant(ast, node)) {
                ret = 1;
            }
            break;
        case FUNCTION_DECLARATION:
            if (symbol_add_function(ast, node)) {
                ret = 1;
            }
            break;
        case TYPE_DECLARATION:
            break;
        default: break;
    }

    for (i = 0; i < node->children; ++i) {
        if (symbol_generate(ast, node->child[i])) {
            ret = 1;
        }
    }
    
    return ret;
}